

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

void CPP::writeResourceIcon
               (QTextStream *output,QString *iconName,QString *indent,DomResourceIcon *i)

{
  DomResourcePixmap *pDVar1;
  char cVar2;
  uint uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = i->m_children;
  if ((uVar3 & 1) != 0) {
    pDVar1 = i->m_normalOff;
    local_48.d = (pDVar1->m_text).d.d;
    local_48.ptr = (pDVar1->m_text).d.ptr;
    local_48.size = (pDVar1->m_text).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeIconAddFile(output,indent,iconName,(QString *)&local_48,"Normal","Off");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 2) != 0) {
    pDVar1 = i->m_normalOn;
    local_48.d = (pDVar1->m_text).d.d;
    local_48.ptr = (pDVar1->m_text).d.ptr;
    local_48.size = (pDVar1->m_text).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeIconAddFile(output,indent,iconName,(QString *)&local_48,"Normal","On");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 4) != 0) {
    pDVar1 = i->m_disabledOff;
    local_48.d = (pDVar1->m_text).d.d;
    local_48.ptr = (pDVar1->m_text).d.ptr;
    local_48.size = (pDVar1->m_text).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeIconAddFile(output,indent,iconName,(QString *)&local_48,"Disabled","Off");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 8) != 0) {
    pDVar1 = i->m_disabledOn;
    local_48.d = (pDVar1->m_text).d.d;
    local_48.ptr = (pDVar1->m_text).d.ptr;
    local_48.size = (pDVar1->m_text).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeIconAddFile(output,indent,iconName,(QString *)&local_48,"Disabled","On");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 0x10) != 0) {
    pDVar1 = i->m_activeOff;
    local_48.d = (pDVar1->m_text).d.d;
    local_48.ptr = (pDVar1->m_text).d.ptr;
    local_48.size = (pDVar1->m_text).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeIconAddFile(output,indent,iconName,(QString *)&local_48,"Active","Off");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar3 = i->m_children;
  }
  if ((uVar3 & 0x20) != 0) {
    pDVar1 = i->m_activeOn;
    local_48.d = (pDVar1->m_text).d.d;
    local_48.ptr = (pDVar1->m_text).d.ptr;
    local_48.size = (pDVar1->m_text).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeIconAddFile(output,indent,iconName,(QString *)&local_48,"Active","On");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    uVar3 = i->m_children;
  }
  cVar2 = (char)uVar3;
  if ((uVar3 & 0x40) != 0) {
    pDVar1 = i->m_selectedOff;
    local_48.d = (pDVar1->m_text).d.d;
    local_48.ptr = (pDVar1->m_text).d.ptr;
    local_48.size = (pDVar1->m_text).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeIconAddFile(output,indent,iconName,(QString *)&local_48,"Selected","Off");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    cVar2 = (char)i->m_children;
  }
  if (cVar2 < '\0') {
    pDVar1 = i->m_selectedOn;
    local_48.d = (pDVar1->m_text).d.d;
    local_48.ptr = (pDVar1->m_text).d.ptr;
    local_48.size = (pDVar1->m_text).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    writeIconAddFile(output,indent,iconName,(QString *)&local_48,"Selected","On");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void writeResourceIcon(QTextStream &output,
                              const QString &iconName,
                              const QString &indent,
                              const DomResourceIcon *i)
{
    if (i->hasElementNormalOff()) {
        writeIconAddFile(output, indent, iconName, i->elementNormalOff()->text(),
                         "Normal", "Off");
    }
    if (i->hasElementNormalOn()) {
        writeIconAddFile(output, indent, iconName, i->elementNormalOn()->text(),
                         "Normal", "On");
    }
    if (i->hasElementDisabledOff()) {
        writeIconAddFile(output, indent, iconName, i->elementDisabledOff()->text(),
                         "Disabled", "Off");
    }
    if (i->hasElementDisabledOn()) {
        writeIconAddFile(output, indent, iconName, i->elementDisabledOn()->text(),
                         "Disabled", "On");
    }
    if (i->hasElementActiveOff()) {
        writeIconAddFile(output, indent, iconName, i->elementActiveOff()->text(),
                         "Active", "Off");
    }
    if (i->hasElementActiveOn()) {
        writeIconAddFile(output, indent, iconName, i->elementActiveOn()->text(),
                         "Active", "On");
    }
    if (i->hasElementSelectedOff()) {
        writeIconAddFile(output, indent, iconName, i->elementSelectedOff()->text(),
                         "Selected", "Off");
    }
    if (i->hasElementSelectedOn()) {
        writeIconAddFile(output, indent, iconName, i->elementSelectedOn()->text(),
                         "Selected", "On");
    }
}